

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pivotref.cpp
# Opt level: O2

string * __thiscall
duckdb::PivotColumn::ToString_abi_cxx11_(string *__return_storage_ptr__,PivotColumn *this)

{
  pointer pbVar1;
  pointer pbVar2;
  const_reference pvVar3;
  const_reference this_00;
  const_reference this_01;
  pointer pPVar4;
  const_reference pvVar5;
  idx_t v;
  ulong __n;
  idx_t n;
  ulong uVar6;
  idx_t n_1;
  string sStack_78;
  vector<duckdb::PivotColumnEntry,_true> *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (this->unpivot_names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->unpivot_names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    if ((this->pivot_expressions).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->pivot_expressions).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0167e422;
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)(this->pivot_expressions).
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->pivot_expressions).
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      if (uVar6 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      this_00 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(&this->pivot_expressions,uVar6);
      pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_00);
      (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&sStack_78,pPVar4);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&sStack_78);
    }
  }
  else {
    if ((long)pbVar2 - (long)pbVar1 == 0x20) {
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&this->unpivot_names,0);
      KeywordHelper::WriteOptionallyQuoted(&sStack_78,pvVar3,'\"',true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&sStack_78);
      goto LAB_0167e422;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)(this->unpivot_names).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->unpivot_names).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
      if (uVar6 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&this->unpivot_names,uVar6);
      KeywordHelper::WriteOptionallyQuoted(&sStack_78,pvVar3,'\"',true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&sStack_78);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0167e422:
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->pivot_enum)._M_string_length == 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_58 = &this->entries;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)(this->entries).
                              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                              .
                              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->entries).
                              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                              .
                              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 6); uVar6 = uVar6 + 1) {
      this_01 = vector<duckdb::PivotColumnEntry,_true>::get<true>(local_58,uVar6);
      if (uVar6 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((this_01->expr).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
          (ParsedExpression *)0x0) {
        if ((long)(this_01->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this_01->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x40) {
          pvVar5 = vector<duckdb::Value,_true>::get<true>(&this_01->values,0);
          Value::ToSQLString_abi_cxx11_(&sStack_78,pvVar5);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_0167e516;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        for (__n = 0; __n < (ulong)((long)(this_01->values).
                                          super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                          .
                                          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this_01->values).
                                          super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                          .
                                          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 6);
            __n = __n + 1) {
          if (__n != 0) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          pvVar5 = vector<duckdb::Value,_true>::get<true>(&this_01->values,__n);
          Value::ToSQLString_abi_cxx11_(&sStack_78,pvVar5);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&sStack_78);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&this_01->expr);
        (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&sStack_78,pPVar4);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0167e516:
        ::std::__cxx11::string::~string((string *)&sStack_78);
      }
      if ((this_01->alias)._M_string_length != 0) {
        KeywordHelper::WriteOptionallyQuoted(&local_50,&this_01->alias,'\"',true);
        ::std::operator+(&sStack_78," AS ",&local_50);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&sStack_78);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    KeywordHelper::WriteOptionallyQuoted(&sStack_78,&this->pivot_enum,'\"',true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

string PivotColumn::ToString() const {
	string result;
	if (!unpivot_names.empty()) {
		D_ASSERT(pivot_expressions.empty());
		// unpivot
		if (unpivot_names.size() == 1) {
			result += KeywordHelper::WriteOptionallyQuoted(unpivot_names[0]);
		} else {
			result += "(";
			for (idx_t n = 0; n < unpivot_names.size(); n++) {
				if (n > 0) {
					result += ", ";
				}
				result += KeywordHelper::WriteOptionallyQuoted(unpivot_names[n]);
			}
			result += ")";
		}
	} else if (!pivot_expressions.empty()) {
		// pivot
		result += "(";
		for (idx_t n = 0; n < pivot_expressions.size(); n++) {
			if (n > 0) {
				result += ", ";
			}
			result += pivot_expressions[n]->ToString();
		}
		result += ")";
	}
	result += " IN ";
	if (pivot_enum.empty()) {
		result += "(";
		for (idx_t e = 0; e < entries.size(); e++) {
			auto &entry = entries[e];
			if (e > 0) {
				result += ", ";
			}
			if (entry.expr) {
				D_ASSERT(entry.values.empty());
				result += entry.expr->ToString();
			} else if (entry.values.size() == 1) {
				result += entry.values[0].ToSQLString();
			} else {
				result += "(";
				for (idx_t v = 0; v < entry.values.size(); v++) {
					if (v > 0) {
						result += ", ";
					}
					result += entry.values[v].ToSQLString();
				}
				result += ")";
			}
			if (!entry.alias.empty()) {
				result += " AS " + KeywordHelper::WriteOptionallyQuoted(entry.alias);
			}
		}
		result += ")";
	} else {
		result += KeywordHelper::WriteOptionallyQuoted(pivot_enum);
	}
	return result;
}